

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_matcher.hpp
# Opt level: O0

void __thiscall
iutest::detail::PointeeMatcher<iutest::detail::NotNullMatcher>::~PointeeMatcher
          (PointeeMatcher<iutest::detail::NotNullMatcher> *this)

{
  PointeeMatcher<iutest::detail::NotNullMatcher> *this_local;
  
  NotNullMatcher::~NotNullMatcher(&this->m_expected);
  IMatcher::~IMatcher(&this->super_IMatcher);
  return;
}

Assistant:

class PointeeMatcher IUTEST_CXX_FINAL : public IMatcher
{
public:
    explicit PointeeMatcher(const T& expected) : m_expected(expected) {}

public:
    template<typename U>
    AssertionResult operator ()(const U& actual)
    {
        if IUTEST_COND_LIKELY( Check(actual) )
        {
            return AssertionSuccess();
        }
        return AssertionFailure() << WhichIs();
    }

public:
    ::std::string WhichIs() const IUTEST_CXX_OVERRIDE
    {
        iu_global_format_stringstream strm;
        strm << "Points To: " << m_expected;
        return strm.str();
    }